

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void xercesc_4_0::XMLUri::normalizeURI(XMLCh *systemURI,XMLBuffer *normalizedURI)

{
  XMLCh XVar1;
  XMLSize_t XVar2;
  
  normalizedURI->fIndex = 0;
  do {
    while( true ) {
      XVar1 = *systemURI;
      if (XVar1 == L'%') break;
      if (XVar1 == L'\0') {
        return;
      }
LAB_0025d854:
      if (normalizedURI->fIndex == normalizedURI->fCapacity) {
        XMLBuffer::ensureCapacity(normalizedURI,1);
      }
      XVar2 = normalizedURI->fIndex;
      normalizedURI->fIndex = XVar2 + 1;
      normalizedURI->fBuffer[XVar2] = XVar1;
      systemURI = systemURI + 1;
    }
    if ((systemURI[1] != L'2') || (systemURI[2] != L'0')) goto LAB_0025d854;
    if (normalizedURI->fIndex == normalizedURI->fCapacity) {
      XMLBuffer::ensureCapacity(normalizedURI,1);
    }
    systemURI = systemURI + 3;
    XVar2 = normalizedURI->fIndex;
    normalizedURI->fIndex = XVar2 + 1;
    normalizedURI->fBuffer[XVar2] = L' ';
  } while( true );
}

Assistant:

void XMLUri::normalizeURI(const XMLCh*     const systemURI,
                                XMLBuffer&       normalizedURI)
{
    const XMLCh* pszSrc = systemURI;

    normalizedURI.reset();

    while (*pszSrc) {

        if ((*(pszSrc) == chPercent)
        &&  (*(pszSrc+1) == chDigit_2)
        &&  (*(pszSrc+2) == chDigit_0))
        {
            pszSrc += 3;
            normalizedURI.append(chSpace);
        }
        else
        {
            normalizedURI.append(*pszSrc);
            pszSrc++;
        }
    }
}